

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

sudoku_policko __thiscall Sudoku::policko(Sudoku *this,int x,int y)

{
  sudoku_policko sVar1;
  
  sVar1 = (sudoku_policko)0x20;
  if ((uint)y < 9 && (uint)x < 9) {
    sVar1 = (this->s).pole[(uint)(y * 9 + x)];
  }
  return sVar1;
}

Assistant:

sudoku_policko Sudoku::policko (int x,int y)
{
  if(0 <= x && x < 9)
    if(0 <= y && y < 9)
      return s.pole[y*9+x];
  sudoku_policko err;
  err.error = true;
  return err;
}